

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O2

void benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic
               (BenchmarkContext *context)

{
  int64_t size;
  StorageArray<boost::recursive_mutex> m;
  allocator local_51;
  anon_class_8_1_54a3980d local_50;
  string local_48;
  StorageArray<boost::recursive_mutex> local_28;
  
  size = context->_iterationsCount;
  StorageArray<boost::recursive_mutex>::StorageArray(&local_28,size);
  std::__cxx11::string::string((string *)&local_48,"create",&local_51);
  local_50.m = &local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"mutex",(allocator *)&local_50);
  (*context->_vptr_BenchmarkContext[2])(context,&local_48,size);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"lock",&local_51);
  local_50.m = &local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"unlock",&local_51);
  local_50.m = &local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_3_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"destroy",&local_51);
  local_50.m = &local_28;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_4_>
            (context,&local_48,size,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  StorageArray<boost::recursive_mutex>::~StorageArray(&local_28);
  return;
}

Assistant:

static void Basic(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<MutexType> m(n);

            context.Profile("create", n, [&]{ m.Construct(); });
            context.MeasureMemory("mutex", n);
            context.Profile("lock", n, [&]{ m.ForEach([](MutexType& m){ m.lock(); }); });
            context.Profile("unlock", n, [&]{ m.ForEach([](MutexType& m){ m.unlock(); }); });
            context.Profile("destroy", n, [&]{ m.Destruct(); });
        }